

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unit.cpp
# Opt level: O3

offset_type
unicpp::as_graphemes::get_codepoint_distance(string *str,const_iterator *b,const_iterator *it)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char *pcVar2;
  offset_type oVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  pbVar1 = (b->codepoint_it).internal_string;
  local_20._M_current = (b->codepoint_it).internal_it._M_current;
  pcVar2 = (it->codepoint_it).internal_it._M_current;
  if (local_20._M_current == pcVar2) {
    oVar3 = 0;
  }
  else {
    oVar3 = 0;
    do {
      iterate_next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                (&local_20,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )((pbVar1->_M_dataplus)._M_p + pbVar1->_M_string_length));
      oVar3 = oVar3 + 1;
    } while (local_20._M_current != pcVar2);
  }
  return oVar3;
}

Assistant:

as_graphemes::offset_type as_graphemes::get_codepoint_distance(const string & str, const as_graphemes::const_iterator & b, const as_graphemes::const_iterator & it)
{
    return std::distance(b.codepoint_it, it.codepoint_it);
}